

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O0

void __thiscall TPZAnalysis::OptimizeBandwidth(TPZAnalysis *this)

{
  int64_t iVar1;
  TPZCompEl **ppTVar2;
  TPZRenumbering *pTVar3;
  long in_RDI;
  ofstream out;
  bool shouldstop;
  int64_t locnindep;
  set<long,_std::less<long>,_std::allocator<long>_> depconlist;
  set<long,_std::less<long>,_std::allocator<long>_> indepconlist;
  TPZCompEl *cel;
  int maxelcon;
  int64_t ncel;
  int64_t el;
  int64_t nel;
  int64_t nindep;
  TPZStack<long,_10> elgraphindex;
  TPZStack<long,_10> elgraph;
  TPZVec<long> iperm;
  TPZVec<long> perm;
  TPZVec<long> *in_stack_fffffffffffffb90;
  TPZVec<long> *in_stack_fffffffffffffb98;
  TPZStack<long,_10> *in_stack_fffffffffffffba0;
  int64_t in_stack_fffffffffffffba8;
  TPZCompMesh *in_stack_fffffffffffffbb0;
  TPZVec<long> *in_stack_fffffffffffffbb8;
  TPZCompMesh *in_stack_fffffffffffffbc0;
  TPZVec<long> *in_stack_fffffffffffffc20;
  TPZStack<long,_10> *in_stack_fffffffffffffc28;
  TPZCompMesh *in_stack_fffffffffffffc30;
  undefined1 local_1d0 [16];
  TPZCompMesh *in_stack_fffffffffffffe40;
  TPZCompEl *local_170;
  int local_164;
  TPZCompEl **local_160;
  TPZCompEl **local_158;
  TPZCompEl **local_150;
  undefined4 local_144;
  TPZCompEl **local_140;
  TPZVec<long> local_48;
  TPZVec<long> local_28;
  
  if (*(long *)(in_RDI + 0x10) != 0) {
    TPZVec<long>::TPZVec(&local_28);
    TPZVec<long>::TPZVec(&local_48);
    TPZStack<long,_10>::TPZStack(in_stack_fffffffffffffba0);
    TPZStack<long,_10>::TPZStack(in_stack_fffffffffffffba0);
    local_140 = (TPZCompEl **)TPZCompMesh::NIndependentConnects(in_stack_fffffffffffffbb0);
    if (local_140 == (TPZCompEl **)0x0) {
      local_144 = 1;
    }
    else {
      TPZCompMesh::ComputeElGraph
                (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      iVar1 = TPZVec<long>::NElements((TPZVec<long> *)&stack0xfffffffffffffec8);
      local_150 = (TPZCompEl **)(iVar1 + -1);
      local_160 = (TPZCompEl **)TPZCompMesh::NElements((TPZCompMesh *)0x1c31275);
      local_164 = 0;
      for (local_158 = (TPZCompEl **)0x0; (long)local_158 < (long)local_160;
          local_158 = (TPZCompEl **)((long)local_158 + 1)) {
        TPZCompMesh::ElementVec(*(TPZCompMesh **)(in_RDI + 0x10));
        ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                            ((TPZChunkVector<TPZCompEl_*,_10> *)in_stack_fffffffffffffbb0,
                             in_stack_fffffffffffffba8);
        local_170 = *ppTVar2;
        if (local_170 != (TPZCompEl *)0x0) {
          in_stack_fffffffffffffbb8 = (TPZVec<long> *)&stack0xfffffffffffffe60;
          std::set<long,_std::less<long>,_std::allocator<long>_>::set
                    ((set<long,_std::less<long>,_std::allocator<long>_> *)0x1c31316);
          in_stack_fffffffffffffbc0 = (TPZCompMesh *)local_1d0;
          std::set<long,_std::less<long>,_std::allocator<long>_>::set
                    ((set<long,_std::less<long>,_std::allocator<long>_> *)0x1c31328);
          (**(code **)(*(long *)local_170 + 0x1d8))
                    (local_170,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbc0);
          in_stack_fffffffffffffbb0 =
               (TPZCompMesh *)
               std::set<long,_std::less<long>,_std::allocator<long>_>::size
                         ((set<long,_std::less<long>,_std::allocator<long>_> *)0x1c31355);
          if ((long)in_stack_fffffffffffffbb0 <= (long)local_164) {
            in_stack_fffffffffffffbb0 = (TPZCompMesh *)(long)local_164;
          }
          local_164 = (int)in_stack_fffffffffffffbb0;
          std::set<long,_std::less<long>,_std::allocator<long>_>::~set
                    ((set<long,_std::less<long>,_std::allocator<long>_> *)0x1c313a4);
          std::set<long,_std::less<long>,_std::allocator<long>_>::~set
                    ((set<long,_std::less<long>,_std::allocator<long>_> *)0x1c313b1);
        }
      }
      pTVar3 = TPZAutoPointer<TPZRenumbering>::operator->
                         ((TPZAutoPointer<TPZRenumbering> *)(in_RDI + 0x2a8));
      TPZRenumbering::SetElementsNodes(pTVar3,(int64_t)local_150,(int64_t)local_140);
      pTVar3 = TPZAutoPointer<TPZRenumbering>::operator->
                         ((TPZAutoPointer<TPZRenumbering> *)(in_RDI + 0x2a8));
      TPZRenumbering::SetElementGraph(pTVar3,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
      pTVar3 = TPZAutoPointer<TPZRenumbering>::operator->
                         ((TPZAutoPointer<TPZRenumbering> *)(in_RDI + 0x2a8));
      (*(pTVar3->super_TPZSavable)._vptr_TPZSavable[10])(pTVar3,&local_28,&local_48);
      TPZCompMesh::Permute(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      if (100000 < (long)local_150) {
        std::operator<<((ostream *)&std::cout,"Applying Saddle Permute\n");
      }
      TPZCompMesh::SaddlePermute(in_stack_fffffffffffffe40);
      local_144 = 0;
    }
    TPZStack<long,_10>::~TPZStack((TPZStack<long,_10> *)0x1c316a2);
    TPZStack<long,_10>::~TPZStack((TPZStack<long,_10> *)0x1c316af);
    TPZVec<long>::~TPZVec(in_stack_fffffffffffffb90);
    TPZVec<long>::~TPZVec(in_stack_fffffffffffffb90);
  }
  return;
}

Assistant:

void TPZAnalysis::OptimizeBandwidth() {
	//enquanto nao compilamos o BOOST no windows, vai o sloan antigo
#ifdef WIN32
	if(!fCompMesh) return;
//    fCompMesh->InitializeBlock();
	TPZVec<int64_t> perm,iperm;
	
	TPZStack<int64_t> elgraph;
	TPZStack<int64_t> elgraphindex;
	int64_t nindep = fCompMesh->NIndependentConnects();
	fCompMesh->ComputeElGraph(elgraph,elgraphindex);
	int64_t nel = elgraphindex.NElements()-1;
	TPZSloan sloan(nel,nindep);
	sloan.SetElementGraph(elgraph,elgraphindex);
	sloan.Resequence(perm,iperm);
	fCompMesh->Permute(perm);
#else
	if(!fCompMesh) return;
//    fCompMesh->InitializeBlock();
	
	TPZVec<int64_t> perm,iperm;
	
	TPZStack<int64_t> elgraph,elgraphindex;
	int64_t nindep = fCompMesh->NIndependentConnects();
    
    /// if there are no connects, there is no bandwidth to be optimized
    if(nindep == 0) return;
    
	fCompMesh->ComputeElGraph(elgraph,elgraphindex);
	int64_t nel = elgraphindex.NElements()-1;
	int64_t el,ncel = fCompMesh->NElements();
	int maxelcon = 0;
	for(el = 0; el<ncel; el++)
	{
		TPZCompEl *cel = fCompMesh->ElementVec()[el];
		if(!cel) continue;
		std::set<int64_t> indepconlist,depconlist;
		cel->BuildConnectList(indepconlist,depconlist);
		int64_t locnindep = indepconlist.size();
		maxelcon = maxelcon < locnindep ? locnindep : maxelcon;
	}
	fRenumber->SetElementsNodes(nel,nindep);
	fRenumber->SetElementGraph(elgraph,elgraphindex);
#ifdef PZ_LOG2
    if(logger.isDebugEnabled())
    {
        std::stringstream sout;
        fRenumber->Print(elgraph, elgraphindex, "Elgraph of submesh", sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    bool shouldstop = false;
    try {
        fRenumber->Resequence(perm,iperm);
    } catch(...)
    {
        fRenumber->PlotElementGroups("ElementGroups.vtk", fCompMesh);
        std::ofstream out("fElementGroups.txt");
        fCompMesh->Print(out);
        shouldstop = true;
    }
    if(shouldstop) DebugStop();
    
	fCompMesh->Permute(perm);
    if (nel > 100000) {
        std::cout << "Applying Saddle Permute\n";
    }
    fCompMesh->SaddlePermute();
//    fCompMesh->SaddlePermute2();
	
#endif
	
}